

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int local_58;
  int local_54;
  int n_ESIs;
  char *local_48;
  uint32_t *ESIs;
  int n_max_ESIs;
  
  n_ESIs = 0;
  n_max_ESIs = 0x20;
  ESIs = (uint32_t *)malloc(0x80);
  bVar1 = false;
  local_54 = 0x10;
  local_58 = 0x3c;
  while( true ) {
    while (iVar3 = getopt(argc,argv,"hm:K:T:i:"), iVar3 == 0x69) {
      parse_esis(&n_ESIs,&n_max_ESIs,&ESIs,_optarg);
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x4b) {
      local_58 = atoi(_optarg);
    }
    else if (iVar3 == 0x54) {
      local_54 = atoi(_optarg);
    }
    else {
      if (iVar3 == 0x68) {
        puts(
            "Tool to compute an intermediate block\n\nReads a set of input symbols from stdin and writes a\ngenerated intermediate block to stdout\n\n   -h       Display help screen and exit\n\n   -m <m>   Set operating mode, can be either:\n             iblock:  generate intermediate block from\n                      input symbols [default]\n             iosym:   generate code symbols from\n                      intermediate block\n   -K #     Set code dimension\n   -T #     Set symbol size\n   -i #,... Set symbol identifiers of symbols\n              iblock mode: ESIs of input symbols\n              iosym mode: ESIs of symbols to generate\n"
            );
        return 0;
      }
      if (iVar3 == 0x6d) {
        local_48 = _optarg;
        iVar3 = strcasecmp(_optarg,"iblock");
        bVar1 = false;
        if (iVar3 != 0) {
          iVar3 = strcasecmp(local_48,"iosym");
          bVar1 = true;
          if (iVar3 != 0) {
            fprintf(_stderr,"Error: Mode `%s\' unknown (-m).\n",local_48);
            return 1;
          }
        }
      }
      else if (iVar3 == 0x3f) {
        exit(1);
      }
    }
  }
  iVar3 = fileno(_stdout);
  iVar3 = isatty(iVar3);
  if (iVar3 != 0) {
    fwrite("Error:  Output is a TTY, refusing output since it will garble the screen.\n",0x4a,1,
           _stderr);
    return 1;
  }
  if (bVar1) {
    _Var2 = gen_iosym(local_58,local_54,n_ESIs,ESIs);
  }
  else {
    _Var2 = gen_iblock(local_58,local_54,n_ESIs,ESIs);
  }
  free(ESIs);
  return (uint)(_Var2 ^ 1);
}

Assistant:

int main(int argc, char** argv)
{
	int K = 60;
	int T = 16;
	opmode mode = OPMODE_IBLOCK;

	/* ESI array */
	int n_ESIs = 0;
	int n_max_ESIs = 32;
	uint32_t* ESIs = malloc(n_max_ESIs * sizeof(uint32_t));

	/* Read command line arguments */
	int c;
	while ((c = getopt(argc, argv, "hm:K:T:i:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			return EXIT_SUCCESS;
		case 'm':
			if (strcasecmp(optarg, "iblock") == 0) {
				mode = OPMODE_IBLOCK;
			} else if (strcasecmp(optarg, "iosym") == 0) {
				mode = OPMODE_IOSYM;
			} else {
				fprintf(stderr, "Error: Mode `%s' unknown "
						"(-m).\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		case 'K':
			K = atoi(optarg);
			break;
		case 'T':
			T = atoi(optarg);
			break;
		case 'i': {
			parse_esis(&n_ESIs, &n_max_ESIs, &ESIs, optarg);
			break;
		}
		case '?':
			exit(EXIT_FAILURE);
		};
	}


	/* Check TTY status */
	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Error:  Output is a TTY, refusing output "
		  "since it will garble the screen.\n");
		return EXIT_FAILURE;
	}

	/* Create Inter Program */
	bool success = true;
	switch (mode) {
		case OPMODE_IBLOCK:
			success = gen_iblock(K, T, n_ESIs, ESIs);
			break;
		case OPMODE_IOSYM:
			success = gen_iosym(K, T, n_ESIs, ESIs);
			break;
	};

	/* Finish */
	free(ESIs);
	return success ? EXIT_SUCCESS : EXIT_FAILURE;
}